

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_palloc.c
# Opt level: O3

void * ngx_palloc_large(ngx_pool_t *pool,size_t size)

{
  ulong uVar1;
  void *__ptr;
  ngx_pool_t *pnVar2;
  long lVar3;
  ngx_pool_large_t *pnVar4;
  ngx_pool_t **ppnVar5;
  ngx_pool_t *pnVar6;
  ngx_pool_t *pnVar7;
  size_t size_00;
  
  __ptr = ngx_alloc(size,pool->log);
  if (__ptr != (void *)0x0) {
    pnVar4 = pool->large;
    if (pnVar4 != (ngx_pool_large_t *)0x0) {
      lVar3 = 5;
      do {
        if (pnVar4->alloc == (void *)0x0) {
          pnVar4->alloc = __ptr;
          return __ptr;
        }
        lVar3 = lVar3 + -1;
      } while ((lVar3 != 0) && (pnVar4 = pnVar4->next, pnVar4 != (ngx_pool_large_t *)0x0));
    }
    pnVar2 = pool->current;
    do {
      pnVar4 = (ngx_pool_large_t *)((ulong)((pnVar2->d).last + 7) & 0xfffffffffffffff8);
      if (0xf < (ulong)((long)(pnVar2->d).end - (long)pnVar4)) {
        (pnVar2->d).last = (u_char *)(pnVar4 + 1);
        goto LAB_001141b9;
      }
      pnVar2 = (pnVar2->d).next;
    } while (pnVar2 != (ngx_pool_t *)0x0);
    size_00 = (long)(pool->d).end - (long)pool;
    pnVar2 = (ngx_pool_t *)ngx_memalign(0x10,size_00,pool->log);
    if (pnVar2 != (ngx_pool_t *)0x0) {
      (pnVar2->d).end = (u_char *)(size_00 + (long)pnVar2);
      pnVar4 = (ngx_pool_large_t *)((ulong)((long)&pnVar2->max + 7U) & 0xfffffffffffffff8);
      (pnVar2->d).next = (ngx_pool_t *)0x0;
      (pnVar2->d).failed = 0;
      (pnVar2->d).last = (u_char *)(pnVar4 + 1);
      pnVar7 = pool->current;
      pnVar6 = (pnVar7->d).next;
      while (ppnVar5 = &(pnVar7->d).next, pnVar6 != (ngx_pool_t *)0x0) {
        uVar1 = (pnVar7->d).failed;
        (pnVar7->d).failed = uVar1 + 1;
        pnVar7 = pnVar6;
        if (4 < uVar1) {
          pool->current = pnVar6;
          pnVar7 = *ppnVar5;
        }
        pnVar6 = (pnVar7->d).next;
      }
      *ppnVar5 = pnVar2;
LAB_001141b9:
      if (pnVar4 != (ngx_pool_large_t *)0x0) {
        pnVar4->alloc = __ptr;
        pnVar4->next = pool->large;
        pool->large = pnVar4;
        return __ptr;
      }
    }
    free(__ptr);
  }
  return (void *)0x0;
}

Assistant:

static void *
ngx_palloc_large(ngx_pool_t *pool, size_t size)
{
    void              *p;
    ngx_uint_t         n;
    ngx_pool_large_t  *large;

    p = ngx_alloc(size, pool->log);
    if (p == NULL) {
        return NULL;
    }

    n = 0;

    for (large = pool->large; large; large = large->next) {
        if (large->alloc == NULL) {
            large->alloc = p;
            return p;
        }

        if (n++ > 3) {
            break;
        }
    }

    large = ngx_palloc_small(pool, sizeof(ngx_pool_large_t), 1);
    if (large == NULL) {
        ngx_free(p);
        return NULL;
    }

    large->alloc = p;
    large->next = pool->large;
    pool->large = large;

    return p;
}